

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Expression(DataParser *parser)

{
  undefined4 *puVar1;
  Variant *pVVar2;
  char cVar3;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  pointer pIVar10;
  pointer pcVar11;
  bool *pbVar12;
  undefined8 *puVar13;
  bool *out_valid_function_name;
  byte bVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long lVar17;
  String name;
  size_type __dnew;
  bool valid_function_name;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [2];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  undefined1 local_88 [40];
  pointer local_60;
  char local_58;
  
  Relational(parser);
  cVar3 = parser->reached_end;
joined_r0x001f1ad1:
  if (cVar3 != '\0') {
    return;
  }
  cVar3 = (parser->expression)._M_dataplus._M_p[parser->index];
  if (cVar3 == '|') {
    DataParser::Match(parser,'|',false);
    if ((parser->reached_end != false) ||
       ((parser->expression)._M_dataplus._M_p[parser->index] != '|')) {
      DataParser::Push(parser);
      bVar14 = parser->reached_end;
      pcVar11 = (parser->expression)._M_dataplus._M_p;
      out_valid_function_name = (bool *)parser->index;
      if ((bool)bVar14 == false) {
        uVar15 = (ulong)out_valid_function_name[(long)pcVar11];
      }
      else {
        uVar15 = 0;
      }
      pbVar12 = (bool *)(parser->expression)._M_string_length;
LAB_001f1d70:
      do {
        out_valid_function_name = out_valid_function_name + 1;
        if ((0x20 < (byte)uVar15) || ((0x100002600U >> (uVar15 & 0x3f) & 1) == 0))
        goto LAB_001f1da3;
        parser->index = (size_t)out_valid_function_name;
        if (out_valid_function_name < pbVar12) {
          if ((bVar14 & 1) == 0) {
            uVar15 = (ulong)out_valid_function_name[(long)pcVar11];
            goto LAB_001f1d70;
          }
        }
        else {
          parser->reached_end = true;
          bVar14 = 1;
        }
        uVar15 = 0;
      } while( true );
    }
    DataParser::Match(parser,'|',true);
    DataParser::Push(parser);
    Relational(parser);
    DataParser::Pop(parser,L);
    Variant::Variant((Variant *)local_b8);
    DataParser::Emit(parser,Or,(Variant *)local_b8);
LAB_001f1b75:
    Variant::~Variant((Variant *)local_b8);
  }
  else {
    if (cVar3 != '?') {
      if (cVar3 != '&') {
        return;
      }
      DataParser::Match(parser,'&',false);
      DataParser::Match(parser,'&',true);
      DataParser::Push(parser);
      Relational(parser);
      DataParser::Pop(parser,L);
      Variant::Variant((Variant *)local_b8);
      DataParser::Emit(parser,And,(Variant *)local_b8);
      goto LAB_001f1b75;
    }
    pIVar4 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pIVar5 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_start;
    Variant::Variant((Variant *)local_88);
    DataParser::Emit(parser,JumpIfZero,(Variant *)local_88);
    Variant::~Variant((Variant *)local_88);
    DataParser::Match(parser,'?',true);
    Expression(parser);
    pIVar6 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pIVar7 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_start;
    Variant::Variant((Variant *)&stack0xffffffffffffffa8);
    DataParser::Emit(parser,Jump,(Variant *)&stack0xffffffffffffffa8);
    Variant::~Variant((Variant *)&stack0xffffffffffffffa8);
    DataParser::Match(parser,':',true);
    pIVar8 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pIVar9 = (parser->program).
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl
             .super__Vector_impl_data._M_start;
    Expression(parser);
    local_60 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pIVar10 = (parser->program).
              super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_b8._0_4_ = 0x5a;
    local_b8._8_8_ = 0x2d;
    pVVar2 = (Variant *)(local_b8 + 8);
    Variant::Set(pVVar2,((long)pIVar8 - (long)pIVar9 >> 4) * -0x5555555555555555);
    puVar1 = (undefined4 *)
             ((long)pIVar4 +
             ((long)(parser->program).
                    super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)pIVar5));
    *puVar1 = local_b8._0_4_;
    Variant::operator=((Variant *)(puVar1 + 2),pVVar2);
    lVar17 = (long)pIVar10 - (long)local_60;
    Variant::~Variant(pVVar2);
    local_e8._0_4_ = 0x4a;
    local_e8._8_8_ = 0x2d;
    pVVar2 = (Variant *)(local_e8 + 8);
    Variant::Set(pVVar2,(lVar17 >> 4) * -0x5555555555555555);
    puVar1 = (undefined4 *)
             ((long)pIVar6 +
             ((long)(parser->program).
                    super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)pIVar7));
    *puVar1 = local_e8._0_4_;
    Variant::operator=((Variant *)(puVar1 + 2),pVVar2);
    Variant::~Variant(pVVar2);
  }
  goto LAB_001f1e00;
LAB_001f1da3:
  local_58 = '\x01';
  VariableOrFunctionName_abi_cxx11_
            ((String *)local_b8,(Parse *)parser,(DataParser *)&stack0xffffffffffffffa8,
             out_valid_function_name);
  if (local_b8._8_8_ == 0) {
    local_88._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x39;
    local_e8._0_8_ = local_d8;
    local_e8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_e8,(ulong)local_88);
    local_d8[0]._M_allocated_capacity = local_88._0_8_;
    *(char *)(local_e8._0_8_ + 0x29) = 't';
    *(char *)(local_e8._0_8_ + 0x2a) = ' ';
    *(char *)(local_e8._0_8_ + 0x2b) = 'a';
    *(char *)(local_e8._0_8_ + 0x2c) = 'n';
    *(char *)(local_e8._0_8_ + 0x2d) = ' ';
    *(char *)(local_e8._0_8_ + 0x2e) = 'e';
    *(char *)(local_e8._0_8_ + 0x2f) = 'm';
    *(char *)(local_e8._0_8_ + 0x30) = 'p';
    *(char *)(local_e8._0_8_ + 0x31) = 't';
    *(char *)(local_e8._0_8_ + 0x32) = 'y';
    *(char *)(local_e8._0_8_ + 0x33) = ' ';
    *(char *)(local_e8._0_8_ + 0x34) = 'n';
    *(char *)(local_e8._0_8_ + 0x35) = 'a';
    *(char *)(local_e8._0_8_ + 0x36) = 'm';
    *(char *)(local_e8._0_8_ + 0x37) = 'e';
    *(char *)(local_e8._0_8_ + 0x38) = '.';
    *(char *)(local_e8._0_8_ + 0x20) = 'm';
    *(char *)(local_e8._0_8_ + 0x21) = 'e';
    *(char *)(local_e8._0_8_ + 0x22) = ' ';
    *(char *)(local_e8._0_8_ + 0x23) = 'b';
    *(char *)(local_e8._0_8_ + 0x24) = 'u';
    *(char *)(local_e8._0_8_ + 0x25) = 't';
    *(char *)(local_e8._0_8_ + 0x26) = ' ';
    *(char *)(local_e8._0_8_ + 0x27) = 'g';
    *(char *)(local_e8._0_8_ + 0x28) = 'o';
    *(char *)(local_e8._0_8_ + 0x29) = 't';
    *(char *)(local_e8._0_8_ + 0x2a) = ' ';
    *(char *)(local_e8._0_8_ + 0x2b) = 'a';
    *(char *)(local_e8._0_8_ + 0x2c) = 'n';
    *(char *)(local_e8._0_8_ + 0x2d) = ' ';
    *(char *)(local_e8._0_8_ + 0x2e) = 'e';
    *(char *)(local_e8._0_8_ + 0x2f) = 'm';
    *(char *)(local_e8._0_8_ + 0x10) = 'f';
    *(char *)(local_e8._0_8_ + 0x11) = 'o';
    *(char *)(local_e8._0_8_ + 0x12) = 'r';
    *(char *)(local_e8._0_8_ + 0x13) = 'm';
    *(char *)(local_e8._0_8_ + 0x14) = ' ';
    *(char *)(local_e8._0_8_ + 0x15) = 'f';
    *(char *)(local_e8._0_8_ + 0x16) = 'u';
    *(char *)(local_e8._0_8_ + 0x17) = 'n';
    *(char *)(local_e8._0_8_ + 0x18) = 'c';
    *(char *)(local_e8._0_8_ + 0x19) = 't';
    *(char *)(local_e8._0_8_ + 0x1a) = 'i';
    *(char *)(local_e8._0_8_ + 0x1b) = 'o';
    *(char *)(local_e8._0_8_ + 0x1c) = 'n';
    *(char *)(local_e8._0_8_ + 0x1d) = ' ';
    *(char *)(local_e8._0_8_ + 0x1e) = 'n';
    *(char *)(local_e8._0_8_ + 0x1f) = 'a';
    *(undefined8 *)local_e8._0_8_ = 0x6465746365707845;
    *(char *)(local_e8._0_8_ + 8) = ' ';
    *(char *)(local_e8._0_8_ + 9) = 'a';
    *(char *)(local_e8._0_8_ + 10) = ' ';
    *(char *)(local_e8._0_8_ + 0xb) = 't';
    *(char *)(local_e8._0_8_ + 0xc) = 'r';
    *(char *)(local_e8._0_8_ + 0xd) = 'a';
    *(char *)(local_e8._0_8_ + 0xe) = 'n';
    *(char *)(local_e8._0_8_ + 0xf) = 's';
    local_e8._8_8_ = local_88._0_8_;
    *(char *)(local_e8._0_8_ + local_88._0_8_) = '\0';
    DataParser::Error(parser,(String *)local_e8);
    local_88._16_8_ = local_d8[0]._M_allocated_capacity;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ == local_d8) goto LAB_001f1f36;
  }
  else {
    if (local_58 != '\0') {
      Function(parser,TransformFnc,(String *)local_b8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_b8._4_4_,local_b8._0_4_),
                        local_a8[0]._M_allocated_capacity + 1);
      }
LAB_001f1e00:
      cVar3 = parser->reached_end;
      goto joined_r0x001f1ad1;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "Expected a transform function name but got an invalid name \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    puVar13 = (undefined8 *)::std::__cxx11::string::append(local_88);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar16) {
      local_d8[0]._0_8_ = paVar16->_M_allocated_capacity;
      local_d8[0]._8_8_ = puVar13[3];
      local_e8._0_8_ = local_d8;
    }
    else {
      local_d8[0]._0_8_ = paVar16->_M_allocated_capacity;
      local_e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar13;
    }
    local_e8._8_8_ = puVar13[1];
    *puVar13 = paVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    DataParser::Error(parser,(String *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8[0]._M_allocated_capacity + 1));
    }
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_88 + 0x10)) goto LAB_001f1f36;
  }
  operator_delete(paVar16,(ulong)(local_88._16_8_ + 1));
LAB_001f1f36:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._4_4_,local_b8._0_4_) == local_a8) {
    return;
  }
  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_a8[0]._M_allocated_capacity + 1);
  return;
}

Assistant:

static void Expression(DataParser& parser)
	{
		Relational(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '&': And(parser); break;
			case '|':
			{
				parser.Match('|', false);
				if (parser.Look() == '|')
					Or(parser);
				else
				{
					parser.Push();
					parser.SkipWhitespace();
					bool valid_function_name = true;
					String name = VariableOrFunctionName(parser, &valid_function_name);
					if (name.empty())
					{
						parser.Error("Expected a transform function name but got an empty name.");
						return;
					}
					if (!valid_function_name)
					{
						parser.Error("Expected a transform function name but got an invalid name '" + name + "'.");
						return;
					}

					Function(parser, Instruction::TransformFnc, std::move(name), true);
				}
			}
			break;
			case '?': Ternary(parser); break;
			default: looping = false;
			}
		}
	}